

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnusedBlockPass.cc
# Opt level: O2

bool flow::transform::eliminateUnusedBlocks(IRHandler *handler)

{
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *plVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  bool bVar4;
  BasicBlock *bb;
  list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> unused;
  value_type local_48;
  _List_node_base local_40;
  undefined8 local_30;
  
  local_40._M_prev = &local_40;
  local_40._M_next = &local_40;
  local_30 = 0;
  plVar1 = &handler->blocks_;
  p_Var2 = (_List_node_base *)plVar1;
  while (p_Var2 = (((_List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 = &local_40, p_Var2 != (_List_node_base *)plVar1) {
    local_48 = (value_type)p_Var2[1]._M_next;
    if ((local_48 !=
         (value_type)
         (plVar1->
         super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
         )._M_impl._M_node.super__List_node_base._M_next[1]._M_next) &&
       ((local_48->predecessors_).
        super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (local_48->predecessors_).
        super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      std::__cxx11::list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::push_back
                ((list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *)&local_40,
                 &local_48);
    }
  }
  while (p_Var3 = (((_List_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *)
                   &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != &local_40) {
    IRHandler::erase(handler,(BasicBlock *)p_Var3[1]._M_next);
  }
  bVar4 = local_40._M_next != &local_40;
  std::__cxx11::_List_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::_M_clear
            ((_List_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *)&local_40);
  return bVar4;
}

Assistant:

bool eliminateUnusedBlocks(IRHandler* handler) {
  std::list<BasicBlock*> unused;

  for (BasicBlock* bb : handler->basicBlocks()) {
    if (bb == handler->getEntryBlock())
      continue;

    if (!bb->predecessors().empty())
      continue;

    unused.push_back(bb);
  }

  for (BasicBlock* bb : unused) {
    // FLOW_TRACE("flow: removing unused BasicBlock {}", bb->name());
    handler->erase(bb);
  }

  return !unused.empty();
}